

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O2

Stream Catch::createStream(string *streamName)

{
  bool bVar1;
  long *plVar2;
  StreamBufImpl<Catch::OutputDebugWriter,_256UL> *this;
  domain_error *this_00;
  undefined8 unaff_RBP;
  ulong uVar3;
  Stream SVar4;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> bStack_38;
  
  bVar1 = std::operator==(streamName,"stdout");
  if (bVar1) {
    plVar2 = &std::cout;
  }
  else {
    bVar1 = std::operator==(streamName,"stderr");
    if (!bVar1) {
      bVar1 = std::operator==(streamName,"debug");
      if (!bVar1) {
        this_00 = (domain_error *)__cxa_allocate_exception(0x10);
        std::operator+(&bStack_38,"Unknown stream: ",streamName);
        std::domain_error::domain_error(this_00,(string *)&bStack_38);
        __cxa_throw(this_00,&std::domain_error::typeinfo,std::domain_error::~domain_error);
      }
      this = (StreamBufImpl<Catch::OutputDebugWriter,_256UL> *)operator_new(0x148);
      uVar3 = CONCAT71((int7)((ulong)unaff_RBP >> 8),1);
      StreamBufImpl<Catch::OutputDebugWriter,_256UL>::StreamBufImpl(this);
      goto LAB_00165994;
    }
    plVar2 = &std::cerr;
  }
  this = *(StreamBufImpl<Catch::OutputDebugWriter,_256UL> **)
          ((long)plVar2 + *(long *)(*plVar2 + -0x18) + 0xe8);
  uVar3 = 0;
LAB_00165994:
  SVar4._8_8_ = uVar3 & 0xffffffff;
  SVar4.streamBuf = (streambuf *)this;
  return SVar4;
}

Assistant:

Stream createStream( std::string const& streamName ) {
        if( streamName == "stdout" ) return Stream( Catch::cout().rdbuf(), false );
        if( streamName == "stderr" ) return Stream( Catch::cerr().rdbuf(), false );
        if( streamName == "debug" ) return Stream( new StreamBufImpl<OutputDebugWriter>, true );

        throw std::domain_error( "Unknown stream: " + streamName );
    }